

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O3

void __thiscall dg::llvmdg::SDG2Dot::dumpEdges(SDG2Dot *this,ostream *out,DGNode *nd)

{
  DGElement *pDVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = *(_Rb_tree_node_base **)(nd + 0x30); p_Var2 != (_Rb_tree_node_base *)(nd + 0x20);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pDVar1 = *(DGElement **)(p_Var2 + 1);
    std::__ostream_insert<char,std::char_traits<char>>(out,"    ",4);
    operator<<(out,(DGElement *)nd);
    std::__ostream_insert<char,std::char_traits<char>>(out," -> ",4);
    operator<<(out,pDVar1);
    std::__ostream_insert<char,std::char_traits<char>>(out,"[style=\"dashed\"]\n",0x11);
  }
  for (p_Var2 = *(_Rb_tree_node_base **)(nd + 0x60); p_Var2 != (_Rb_tree_node_base *)(nd + 0x50);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pDVar1 = *(DGElement **)(p_Var2 + 1);
    std::__ostream_insert<char,std::char_traits<char>>(out,"    ",4);
    operator<<(out,pDVar1);
    std::__ostream_insert<char,std::char_traits<char>>(out," -> ",4);
    operator<<(out,(DGElement *)nd);
    std::__ostream_insert<char,std::char_traits<char>>(out,"[color=red]\n",0xc);
  }
  for (p_Var2 = *(_Rb_tree_node_base **)(nd + 0x120); p_Var2 != (_Rb_tree_node_base *)(nd + 0x110);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pDVar1 = *(DGElement **)(p_Var2 + 1);
    std::__ostream_insert<char,std::char_traits<char>>(out,"    ",4);
    operator<<(out,(DGElement *)nd);
    std::__ostream_insert<char,std::char_traits<char>>(out," -> ",4);
    operator<<(out,pDVar1);
    std::__ostream_insert<char,std::char_traits<char>>(out,"[color=blue]\n",0xd);
  }
  return;
}

Assistant:

void dumpEdges(std::ostream &out, sdg::DGNode &nd) const {
        for (auto *use : nd.uses()) {
            out << "    " << nd << " -> " << *use << "[style=\"dashed\"]\n";
        }
        for (auto *def : nd.memdep()) {
            out << "    " << *def << " -> " << nd << "[color=red]\n";
        }
        for (auto *ctrl : nd.controls()) {
            out << "    " << nd << " -> " << *ctrl << "[color=blue]\n";
        }
    }